

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::MergeCacheTest::createInstance(MergeCacheTest *this,Context *context)

{
  GraphicsCacheTestInstance *pGVar1;
  Deleter<vk::Handle<(vk::HandleType)24>_> *pDVar2;
  Deleter<vk::VkCommandBuffer_s_*> *pDVar3;
  VkPipelineCache obj;
  VkPipeline obj_00;
  Handle<(vk::HandleType)18> HVar4;
  VkDevice pVVar5;
  VkAllocationCallbacks *pVVar6;
  Handle<(vk::HandleType)15> HVar7;
  VkResult VVar8;
  GraphicsCacheTestInstance *this_00;
  DeviceInterface *vk;
  VkDevice device;
  DeviceInterface *pDVar9;
  VkPipelineCache sourceCaches [2];
  size_t dataSize;
  VkPipelineCacheCreateInfo pipelineCacheCreateInfo;
  Move<vk::Handle<(vk::HandleType)18>_> local_a8;
  Move<vk::Handle<(vk::HandleType)15>_> local_88;
  UVec2 local_60;
  _func_int **local_58;
  Context *pCStack_50;
  CacheTestParam *local_48;
  uint auStack_40 [2];
  DeviceInterface *local_38;
  
  this_00 = (GraphicsCacheTestInstance *)operator_new(0x5d8);
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  (this_00->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__MergeCacheTestInstance_00cf19d8;
  pGVar1 = this_00 + 1;
  pDVar2 = &this_00[1].super_CacheTestInstance.m_cmdPool.
            super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter;
  pDVar3 = &this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
            m_data.deleter;
  this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this_00[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_CacheTestInstance.m_param = (CacheTestParam *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .object.m_internal = 0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_deviceIface = (DeviceInterface *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_device = (VkDevice)0x0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  object = (VkCommandBuffer_s *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  deleter.m_deviceIface = (DeviceInterface *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  deleter.m_device = (VkDevice)0x0;
  this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
  deleter.m_pool.m_internal = 0;
  this_00[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
  object.m_internal = 0;
  this_00[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
  deleter.m_deviceIface = (DeviceInterface *)0x0;
  vk = Context::getDeviceInterface((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  pCStack_50 = (Context *)0x0;
  local_48 = (CacheTestParam *)0x0;
  auStack_40[0] = 0;
  auStack_40[1] = 0;
  local_38 = (DeviceInterface *)0x0;
  local_58 = (_func_int **)0x11;
  ::vk::createPipelineCache
            (&local_88,vk,device,(VkPipelineCacheCreateInfo *)&local_58,(VkAllocationCallbacks *)0x0
            );
  pVVar6 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  pVVar5 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  pDVar9 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (pDVar2->m_deviceIface == (DeviceInterface *)0x0) {
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.deleter.m_allocator = (VkAllocationCallbacks *)pVVar5;
    this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
    object = (VkCommandBuffer_s *)pVVar6;
    pDVar2->m_deviceIface = (DeviceInterface *)HVar7.m_internal;
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.deleter.m_device = (VkDevice)pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)15>_> *)
               &this_00[1].super_CacheTestInstance.m_cmdPool.
                super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               (VkPipelineCache)pDVar2->m_deviceIface);
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
    object = (VkCommandBuffer_s *)
             local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    pDVar2->m_deviceIface =
         (DeviceInterface *)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.deleter.m_device =
         (VkDevice)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    if (local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
                (&local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter,
                 (VkPipelineCache)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal);
    }
  }
  ::vk::createPipelineCache
            (&local_88,vk,device,(VkPipelineCacheCreateInfo *)&local_58,(VkAllocationCallbacks *)0x0
            );
  pVVar6 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  pVVar5 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  pDVar9 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (pDVar3->m_deviceIface == (DeviceInterface *)0x0) {
    this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
    deleter.m_pool.m_internal = (deUint64)pVVar5;
    this_00[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
    object.m_internal = (deUint64)pVVar6;
    pDVar3->m_deviceIface = (DeviceInterface *)HVar7.m_internal;
    this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
    deleter.m_device = (VkDevice)pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)15>_> *)
               &this_00[1].super_CacheTestInstance.m_cmdBuffer.
                super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               (VkPipelineCache)pDVar3->m_deviceIface);
    this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
    deleter.m_pool.m_internal =
         (deUint64)local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    this_00[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
    object.m_internal =
         (deUint64)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    pDVar3->m_deviceIface =
         (DeviceInterface *)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
    deleter.m_device =
         (VkDevice)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    if (local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
                (&local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter,
                 (VkPipelineCache)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal);
    }
  }
  local_60.m_data[0] = 0;
  local_60.m_data[1] = 0;
  VVar8 = (*vk->_vptr_DeviceInterface[0x2e])
                    (vk,device,
                     (this_00->super_CacheTestInstance).m_cache.
                     super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                     &local_60,0);
  ::vk::checkResult(VVar8,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x662);
  pDVar9 = (DeviceInterface *)operator_new__((ulong)local_60.m_data);
  this_00[1].super_CacheTestInstance.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
  deleter.m_deviceIface = pDVar9;
  VVar8 = (*vk->_vptr_DeviceInterface[0x2e])
                    (vk,device,
                     (this_00->super_CacheTestInstance).m_cache.
                     super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                     &local_60);
  ::vk::checkResult(VVar8,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x666);
  auStack_40[0] = local_60.m_data[0];
  auStack_40[1] = local_60.m_data[1];
  local_38 = this_00[1].super_CacheTestInstance.m_fence.
             super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface;
  ::vk::createPipelineCache
            (&local_88,vk,device,(VkPipelineCacheCreateInfo *)&local_58,(VkAllocationCallbacks *)0x0
            );
  pVVar6 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  pVVar5 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  pDVar9 = local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal = (deUint64)(pGVar1->super_CacheTestInstance).super_TestInstance._vptr_TestInstance
  ;
  if (obj.m_internal == 0) {
    this_00[1].super_CacheTestInstance.m_param = (CacheTestParam *)pVVar5;
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.object.m_internal = (deUint64)pVVar6;
    (pGVar1->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)HVar7.m_internal;
    this_00[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)15>_> *)
               &this_00[1].super_CacheTestInstance.super_TestInstance.m_context,obj);
    this_00[1].super_CacheTestInstance.m_param =
         (CacheTestParam *)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.object.m_internal =
         (deUint64)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    (pGVar1->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    this_00[1].super_CacheTestInstance.super_TestInstance.m_context =
         (Context *)
         local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    if (local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
                (&local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter,
                 (VkPipelineCache)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal);
    }
  }
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal =
       (deUint64)pDVar2->m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)(pGVar1->super_CacheTestInstance).super_TestInstance._vptr_TestInstance;
  VVar8 = (*vk->_vptr_DeviceInterface[0x2f])(vk,device,pDVar3->m_deviceIface,2);
  ::vk::checkResult(VVar8,"vk.mergePipelineCaches(vkDevice, *m_cacheMerged, 2u, sourceCaches)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x673);
  local_60.m_data = *&(this_00->m_renderSize).m_data;
  SimpleGraphicsPipelineBuilder::buildPipeline
            (&local_a8,(SimpleGraphicsPipelineBuilder *)&this_00->m_pipelineBuilder,&local_60,
             (VkRenderPass)
             (this_00->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkPipelineCache)
             this_00[1].super_CacheTestInstance.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.deleter.m_deviceIface,
             (VkPipelineLayout)
             (this_00->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
             object.m_internal);
  pVVar6 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar5 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar9 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar4.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_48 = (CacheTestParam *)
             local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  auStack_40 = (uint  [2])
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_58 = (_func_int **)
             local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  pCStack_50 = (Context *)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal == 0) {
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         pVVar5;
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
         = pVVar6;
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         HVar4.m_internal;
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = pDVar9;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter
               ,obj_00);
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)local_48;
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)auStack_40;
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         (deUint64)local_58;
    this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pCStack_50;
    if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* MergeCacheTest::createInstance (Context& context) const
{
	return new MergeCacheTestInstance(context, &m_param);
}